

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O2

void objendemt(mcmcxdef *ctx,objnum objn,prpnum prop,uint endofs)

{
  ushort *puVar1;
  short sVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  
  puVar4 = mcmlck(ctx,objn);
  puVar5 = (uchar *)0x0;
  uVar3 = objgetp(ctx,objn,prop,(dattyp *)0x0);
  if (uVar3 != 0) {
    uVar3 = objgetp(ctx,objn,prop,(dattyp *)0x0);
    puVar5 = puVar4 + uVar3;
  }
  sVar2 = ((short)puVar4 - (short)puVar5) + (short)endofs + -6;
  *(short *)(puVar5 + 3) = sVar2;
  *(short *)(puVar4 + 8) = sVar2 + *(short *)(puVar4 + 8) + 6;
  puVar1 = (ushort *)
           ((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmoflg +
           (ulong)((ctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck(ctx,objn);
  return;
}

Assistant:

void objendemt(mcmcxdef *ctx, objnum objn, prpnum prop, uint endofs)
{
    objdef *objptr;
    prpdef *p;
    uint    siz;
    
    objptr = (objdef *)mcmlck(ctx, (mcmon)objn);
    p = objofsp(objptr, objgetp(ctx, objn, prop, (dattyp *)0));
    
    siz = endofs - (((uchar *)prpvalp(p)) - ((uchar *)objptr));
    
    prpsetsize(p, siz);
    objsfree(objptr, objfree(objptr) + siz + PRPHDRSIZ);
    
    /* mark the object as changed, and unlock it */
    mcmtch(ctx, (mcmon)objn);
    mcmunlck(ctx, (mcmon)objn);
}